

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int push_captures(MatchState *ms,char *s,char *e)

{
  undefined8 in_RDX;
  MatchState *in_RSI;
  long in_RDI;
  int nlevels;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  int size;
  int iVar1;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  
  if ((*(int *)(in_RDI + 0x18) == 0) && (in_RSI != (MatchState *)0x0)) {
    size = 1;
  }
  else {
    size = *(int *)(in_RDI + 0x18);
  }
  iVar1 = size;
  luaL_checkstack((lua_State *)CONCAT44(in_stack_ffffffffffffffe4,size),size,(char *)0x1883ae);
  for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
    push_onecapture(in_RSI,(int)((ulong)in_RDX >> 0x20),(char *)CONCAT44(iVar2,iVar1),
                    (char *)CONCAT44(size,in_stack_ffffffffffffffd8));
  }
  return iVar1;
}

Assistant:

static int push_captures(MatchState *ms, const char *s, const char *e)
{
  int i;
  int nlevels = (ms->level == 0 && s) ? 1 : ms->level;
  luaL_checkstack(ms->L, nlevels, "too many captures");
  for (i = 0; i < nlevels; i++)
    push_onecapture(ms, i, s, e);
  return nlevels;  /* number of strings pushed */
}